

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase *
CreateArgumentUpvalueClose(ExpressionContext *ctx,SynBase *source,FunctionData *onwerFunction)

{
  int iVar1;
  undefined4 extraout_var;
  CloseUpvaluesData *node;
  ExprSequence *this;
  undefined4 extraout_var_00;
  
  if (onwerFunction == (FunctionData *)0x0) {
    this = (ExprSequence *)0x0;
  }
  else {
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
    this = (ExprSequence *)CONCAT44(extraout_var,iVar1);
    ExprSequence::ExprSequence
              (this,ctx->allocator,source,ctx->typeVoid,(ArrayView<ExprBase_*>)ZEXT816(0));
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    node = (CloseUpvaluesData *)CONCAT44(extraout_var_00,iVar1);
    node->expr = this;
    node->type = CLOSE_UPVALUES_ARGUMENT;
    node->source = source;
    node->scope = (ScopeData *)0x0;
    node->depth = 0;
    node->next = (CloseUpvaluesData *)0x0;
    node->listed = false;
    IntrusiveList<CloseUpvaluesData>::push_back(&onwerFunction->closeUpvalues,node);
  }
  return &this->super_ExprBase;
}

Assistant:

ExprBase* CreateArgumentUpvalueClose(ExpressionContext &ctx, SynBase *source, FunctionData *onwerFunction)
{
	if(!onwerFunction)
		return NULL;

	ExprSequence *holder = new (ctx.get<ExprSequence>()) ExprSequence(ctx.allocator, source, ctx.typeVoid, ArrayView<ExprBase*>());

	onwerFunction->closeUpvalues.push_back(new (ctx.get<CloseUpvaluesData>()) CloseUpvaluesData(holder, CLOSE_UPVALUES_ARGUMENT, source, NULL, 0));

	return holder;
}